

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O2

DdNode * cuddRemapUnderApprox(DdManager *dd,DdNode *f,int numVars,int threshold,double quality)

{
  DdHalfWord DVar1;
  DdNode *g;
  FILE *__stream;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [12];
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ApproxInfo *pAVar10;
  DdLevelQueue *queue;
  DdLevelQueue *queue_00;
  void *pvVar11;
  ulong uVar12;
  DdNode *pDVar13;
  DdNode *pDVar14;
  uint uVar15;
  DdNode *key;
  uint *puVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  DdNode *local_e8;
  double local_c8;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  NodeData *infoE;
  NodeData *infoT;
  NodeData *infoN;
  DdNode *local_88;
  ApproxInfo *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  double local_68;
  char *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (f == (DdNode *)0x0) {
    fwrite("Cannot subset, nil object\n",0x1a,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
  }
  else {
    puVar16 = (uint *)((ulong)f & 0xfffffffffffffffe);
    if (*puVar16 == 0x7fffffff) {
      return f;
    }
    local_68 = quality;
    pAVar10 = gatherInfo(dd,f,numVars,1);
    if (pAVar10 == (ApproxInfo *)0x0) {
      fwrite("Out-of-memory; Cannot subset\n",0x1d,1,(FILE *)dd->err);
    }
    else {
      queue = cuddLevelQueueInit(dd->size,0x28,pAVar10->size);
      if (queue != (DdLevelQueue *)0x0) {
        queue_00 = cuddLevelQueueInit(dd->size,0x20,dd->initSlots);
        if (queue_00 != (DdLevelQueue *)0x0) {
          iVar6 = 0x7fffffff;
          if ((ulong)*puVar16 != 0x7fffffff) {
            iVar6 = dd->perm[*puVar16];
          }
          pvVar11 = cuddLevelQueueEnqueue(queue,puVar16,iVar6);
          if (pvVar11 != (void *)0x0) {
            uVar8 = (uint)(((ulong)f & 1) == 0);
            auVar5._4_8_ = 0;
            auVar5._0_4_ = (uint)((long)((ulong)uVar8 << 0x3f) >> 0x3f);
            auVar19._0_12_ = auVar5 << 0x20;
            auVar19._12_4_ = (int)((long)((ulong)uVar8 << 0x3f) >> 0x3f);
            auVar25._12_4_ = 0x3ff00000;
            auVar25._0_12_ = ZEXT812(0);
            *(undefined1 (*) [16])((long)pvVar11 + 0x18) =
                 ~auVar19 & auVar25 | ZEXT816(0x3ff0000000000000) & auVar19;
            local_80 = pAVar10;
LAB_00607402:
            do {
              while( true ) {
                pvVar11 = queue->first;
                if ((pvVar11 == (void *)0x0) || (pAVar10->size <= threshold)) {
                  cuddLevelQueueQuit(queue);
                  cuddLevelQueueQuit(queue_00);
                  pDVar13 = RAbuildSubset(dd,f,pAVar10);
                  if ((pDVar13 != (DdNode *)0x0) &&
                     (iVar6 = pAVar10->size, iVar9 = Cudd_DagSize(pDVar13), iVar6 < iVar9)) {
                    __stream = (FILE *)dd->err;
                    uVar8 = pAVar10->size;
                    uVar15 = Cudd_DagSize(pDVar13);
                    fprintf(__stream,"Wrong prediction: %d versus actual %d\n",(ulong)uVar8,
                            (ulong)uVar15);
                  }
                  if (pAVar10->page != (NodeData *)0x0) {
                    free(pAVar10->page);
                    pAVar10->page = (NodeData *)0x0;
                  }
                  st__free_table(pAVar10->table);
                  free(pAVar10);
                  return pDVar13;
                }
                pDVar13 = *(DdNode **)((long)pvVar11 + 0x10);
                iVar6 = st__lookup(pAVar10->table,(char *)pDVar13,(char **)&infoN);
                if (iVar6 == 0) goto LAB_00607ba8;
                if (infoN->parity != 3) break;
                iVar6 = 0x7fffffff;
                if ((ulong)pDVar13->index != 0x7fffffff) {
                  iVar6 = dd->perm[pDVar13->index];
                }
                cuddLevelQueueDequeue(queue,iVar6);
              }
              pDVar14 = (pDVar13->type).kids.T;
              g = (pDVar13->type).kids.E;
              dVar18 = *(double *)((long)pvVar11 + 0x18);
              dVar20 = *(double *)((long)pvVar11 + 0x20);
              iVar6 = Cudd_bddLeq(dd,pDVar14,g);
              uStack_b0 = SUB84(dVar20,0);
              uStack_ac = (undefined4)((ulong)dVar20 >> 0x20);
              local_78 = uStack_b0;
              uStack_74 = uStack_ac;
              uStack_70 = uStack_b0;
              uStack_6c = uStack_ac;
              local_e8 = (DdNode *)dVar18;
              local_88 = pDVar14;
              if (iVar6 == 0) {
                iVar6 = Cudd_bddLeq(dd,g,pDVar14);
                key = (DdNode *)((ulong)g & 0xfffffffffffffffe);
                if (iVar6 != 0) {
                  st__lookup(pAVar10->table,(char *)pDVar14,(char **)&infoT);
                  st__lookup(pAVar10->table,(char *)key,(char **)&infoE);
                  if (infoN->parity != 1) {
                    local_c8 = (&infoE->mintermsP)[g == key] * 0.5 - infoT->mintermsN * 0.5;
                    local_e8 = (DdNode *)CONCAT44(uStack_74,local_78);
                    if (infoE->functionRef == 1) {
                      DVar1 = key->index;
                      goto joined_r0x0060775d;
                    }
                    goto LAB_0060775f;
                  }
                  local_c8 = infoT->mintermsP * 0.5 - (&infoE->mintermsP)[g != key] * 0.5;
                  iVar6 = infoT->functionRef;
                  goto joined_r0x006075c9;
                }
                if (pDVar14->index == key->index) {
                  uVar12 = (ulong)((uint)g & 1);
                  local_e8 = (local_88->type).kids.T;
                  uVar8 = 4;
                  if (local_e8 != (DdNode *)((ulong)(key->type).kids.T ^ uVar12)) {
                    local_e8 = (local_88->type).kids.E;
                    uVar8 = 5;
                    if (local_e8 != (DdNode *)(uVar12 ^ (ulong)(key->type).kids.E))
                    goto LAB_0060765f;
                  }
                }
                else {
LAB_0060765f:
                  uVar8 = 3;
                  local_e8 = (DdNode *)0x0;
                }
                local_c8 = infoN->mintermsP * dVar18 +
                           infoN->mintermsN * (double)CONCAT44(uStack_74,local_78);
                uVar15 = computeSavings(dd,pDVar13,local_e8,pAVar10,queue_00);
                if (local_e8 == (DdNode *)0x0) {
                  local_e8 = (DdNode *)0x0;
                }
                else {
                  st__lookup(pAVar10->table,(char *)((ulong)local_e8 & 0xfffffffffffffffe),&local_60
                            );
                  uVar12 = (ulong)((int)local_e8 * 8 & 8);
                  local_c8 = local_c8 +
                             (*(double *)(local_60 + uVar12) * dVar18 +
                             *(double *)(local_60 + (uVar12 ^ 8)) *
                             (double)CONCAT44(uStack_74,local_78)) * -0.5;
                  uVar15 = uVar15 - 1;
                }
              }
              else {
                st__lookup(pAVar10->table,(char *)pDVar14,(char **)&infoT);
                st__lookup(pAVar10->table,(char *)g,(char **)&infoE);
                if (infoN->parity == 1) {
                  local_c8 = infoE->mintermsP * 0.5 - infoT->mintermsP * 0.5;
                  if (infoE->functionRef == 1) {
                    DVar1 = *(DdHalfWord *)((ulong)g & 0xfffffffffffffffe);
joined_r0x0060775d:
                    if (DVar1 != 0x7fffffff) {
                      iVar6 = computeSavings(dd,g,(DdNode *)0x0,pAVar10,queue_00);
                      if (iVar6 != 0) {
                        uVar8 = 2;
                        goto LAB_006077d8;
                      }
                      break;
                    }
                  }
LAB_0060775f:
                  uVar15 = 1;
                  uVar8 = 2;
                }
                else {
                  local_c8 = infoT->mintermsN * 0.5 - infoE->mintermsN * 0.5;
                  iVar6 = infoT->functionRef;
                  local_e8 = (DdNode *)CONCAT44(uStack_74,local_78);
joined_r0x006075c9:
                  if ((iVar6 == 1) && (*(int *)((ulong)pDVar14 & 0xfffffffffffffffe) != 0x7fffffff))
                  {
                    iVar6 = computeSavings(dd,pDVar14,(DdNode *)0x0,pAVar10,queue_00);
                    if (iVar6 == 0) break;
                    uVar8 = 1;
LAB_006077d8:
                    uVar15 = iVar6 + 1;
                  }
                  else {
                    uVar15 = 1;
                    uVar8 = uVar15;
                  }
                }
                local_c8 = local_c8 * (double)local_e8;
                local_e8 = (DdNode *)0x0;
              }
              iVar6 = 0x7fffffff;
              if ((ulong)pDVar13->index != 0x7fffffff) {
                iVar6 = dd->perm[pDVar13->index];
              }
              cuddLevelQueueDequeue(queue,iVar6);
              dVar17 = pAVar10->minterms;
              iVar6 = pAVar10->size;
              dVar23 = (double)iVar6;
              auVar24._8_8_ = (double)(int)uVar15;
              auVar24._0_8_ = local_c8;
              auVar2._8_4_ = SUB84(dVar23,0);
              auVar2._0_8_ = dVar17;
              auVar2._12_4_ = (int)((ulong)dVar23 >> 0x20);
              auVar25 = divpd(auVar24,auVar2);
              dVar23 = 1.0 - auVar25._0_8_;
              dVar4 = 1.0 - auVar25._8_8_;
              local_58._0_8_ = dVar4 * local_68;
              local_58._8_8_ = dVar4;
              local_48._8_4_ = SUB84(dVar4,0);
              local_48._0_8_ = dVar23;
              local_48._12_4_ = (int)((ulong)dVar4 >> 0x20);
              uVar7 = 0;
              if (dVar23 <= (double)local_58._0_8_) {
LAB_0060792e:
                pDVar14 = (pDVar13->type).kids.T;
                uVar12 = (ulong)pDVar14->index;
                if (uVar12 != 0x7fffffff) {
                  pvVar11 = cuddLevelQueueEnqueue(queue,pDVar14,dd->perm[uVar12]);
                  if ((double)local_48._0_8_ <= (double)local_58._0_8_) {
                    *(double *)((long)pvVar11 + 0x18) =
                         dVar18 * 0.5 + *(double *)((long)pvVar11 + 0x18);
                    dVar17 = (double)CONCAT44(uStack_74,local_78) * 0.5;
                  }
                  else {
                    *(double *)((long)pvVar11 + 0x18) = *(double *)((long)pvVar11 + 0x18) + dVar18;
                    dVar17 = (double)CONCAT44(uStack_74,local_78);
                  }
                  *(double *)((long)pvVar11 + 0x20) = dVar17 + *(double *)((long)pvVar11 + 0x20);
                }
LAB_006079b0:
                pAVar10 = local_80;
                local_b8 = SUB84(dVar18,0);
                uStack_b4 = (undefined4)((ulong)dVar18 >> 0x20);
                uVar21 = uStack_b0;
                uVar22 = uStack_ac;
                if (uVar7 < 2) {
                  puVar16 = (uint *)((ulong)(pDVar13->type).kids.E & 0xfffffffffffffffe);
                  uVar12 = (ulong)*puVar16;
                  if (uVar12 == 0x7fffffff) goto LAB_006079d4;
                  pvVar11 = cuddLevelQueueEnqueue(queue,puVar16,dd->perm[uVar12]);
                  pAVar10 = local_80;
                  if ((undefined1  [16])((undefined1  [16])pDVar13->type & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) {
                    dVar17 = dVar18;
                    if (uVar7 != 1) {
LAB_00607ab8:
                      *(double *)((long)pvVar11 + 0x18) =
                           *(double *)((long)pvVar11 + 0x18) + dVar17 * 0.5;
                      *(double *)((long)pvVar11 + 0x20) =
                           *(double *)((long)pvVar11 + 0x20) + dVar20 * 0.5;
                      goto LAB_00607402;
                    }
                    dVar18 = *(double *)((long)pvVar11 + 0x18);
                    dVar20 = *(double *)((long)pvVar11 + 0x20);
                    uVar21 = local_b8;
                    uVar22 = uStack_b4;
                    local_b8 = uStack_b0;
                    uStack_b4 = uStack_ac;
                  }
                  else {
                    dVar17 = dVar20;
                    dVar20 = dVar18;
                    if (uVar7 != 1) goto LAB_00607ab8;
                    dVar18 = *(double *)((long)pvVar11 + 0x18);
                    dVar20 = *(double *)((long)pvVar11 + 0x20);
                  }
                }
                else {
LAB_006079d4:
                  if ((uVar7 & 0xfffffffe) != 4) goto LAB_00607402;
                  uVar12 = (ulong)*(uint *)((ulong)local_e8 & 0xfffffffffffffffe);
                  if (uVar12 == 0x7fffffff) goto LAB_00607402;
                  pvVar11 = cuddLevelQueueEnqueue
                                      (queue,(uint *)((ulong)local_e8 & 0xfffffffffffffffe),
                                       dd->perm[uVar12]);
                  dVar18 = *(double *)((long)pvVar11 + 0x18);
                  if (((ulong)local_e8 & 1) == 0) {
                    dVar20 = *(double *)((long)pvVar11 + 0x20);
                    uVar21 = local_b8;
                    uVar22 = uStack_b4;
                    local_b8 = uStack_b0;
                    uStack_b4 = uStack_ac;
                  }
                  else {
                    dVar20 = *(double *)((long)pvVar11 + 0x20);
                  }
                }
                dVar20 = (double)CONCAT44(uStack_b4,local_b8) + dVar20;
                auVar3._8_4_ = SUB84(dVar20,0);
                auVar3._0_8_ = (double)CONCAT44(uVar22,uVar21) + dVar18;
                auVar3._12_4_ = (int)((ulong)dVar20 >> 0x20);
                *(undefined1 (*) [16])((long)pvVar11 + 0x18) = auVar3;
                goto LAB_00607402;
              }
              infoN->replace = (char)uVar8;
              local_80->size = iVar6 - uVar15;
              local_80->minterms = dVar17 - local_c8;
              pAVar10 = local_80;
              if (uVar8 == 3) {
                uVar8 = updateRefs(dd,pDVar13,(DdNode *)0x0,local_80,queue_00);
                if (uVar15 != uVar8) {
LAB_00607c16:
                  __assert_fail("savings == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddApprox.c"
                                ,0x640,
                                "int RAmarkNodes(DdManager *, DdNode *, ApproxInfo *, int, double)")
                  ;
                }
              }
              else {
                pDVar14 = local_88;
                if ((uVar8 == 2) || (pDVar14 = g, uVar8 == 1)) {
                  uVar7 = updateRefs(dd,pDVar13,pDVar14,local_80,queue_00);
                }
                else {
                  iVar6 = updateRefs(dd,pDVar13,local_e8,local_80,queue_00);
                  uVar7 = iVar6 - 1;
                }
                if (uVar15 != uVar7) goto LAB_00607c16;
                if (uVar8 != 3) {
                  uVar7 = uVar8;
                  if (uVar8 == 2) goto LAB_0060792e;
                  goto LAB_006079b0;
                }
              }
            } while( true );
          }
LAB_00607ba8:
          cuddLevelQueueQuit(queue);
          queue = queue_00;
        }
        cuddLevelQueueQuit(queue);
      }
      fwrite("Out-of-memory; Cannot subset\n",0x1d,1,(FILE *)dd->err);
      if (pAVar10->page != (NodeData *)0x0) {
        free(pAVar10->page);
        pAVar10->page = (NodeData *)0x0;
      }
      st__free_table(pAVar10->table);
      free(pAVar10);
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddRemapUnderApprox(
  DdManager * dd /* DD manager */,
  DdNode * f /* current DD */,
  int  numVars /* maximum number of variables */,
  int  threshold /* threshold under which approximation stops */,
  double  quality /* minimum improvement for accepted changes */)
{
    ApproxInfo *info;
    DdNode *subset;
    int result;

    if (f == NULL) {
        fprintf(dd->err, "Cannot subset, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    if (Cudd_IsConstant(f)) {
        return(f);
    }

    /* Create table where node data are accessible via a hash table. */
    info = gatherInfo(dd, f, numVars, TRUE);
    if (info == NULL) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    /* Mark nodes that should be replaced by zero. */
    result = RAmarkNodes(dd, f, info, threshold, quality);
    if (result == 0) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        ABC_FREE(info->page);
        st__free_table(info->table);
        ABC_FREE(info);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    /* Build the result. */
    subset = RAbuildSubset(dd, f, info);
#if 1
    if (subset && info->size < Cudd_DagSize(subset))
        (void) fprintf(dd->err, "Wrong prediction: %d versus actual %d\n",
                       info->size, Cudd_DagSize(subset));
#endif
    ABC_FREE(info->page);
    st__free_table(info->table);
    ABC_FREE(info);

#ifdef DD_DEBUG
    if (subset != NULL) {
        cuddRef(subset);
#if 0
        (void) Cudd_DebugCheck(dd);
        (void) Cudd_CheckKeys(dd);
#endif
        if (!Cudd_bddLeq(dd, subset, f)) {
            (void) fprintf(dd->err, "Wrong subset\n");
        }
        cuddDeref(subset);
        dd->errorCode = CUDD_INTERNAL_ERROR;
    }
#endif
    return(subset);

}